

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefEq *curr)

{
  bool bVar1;
  byte bVar2;
  Literal *pLVar3;
  Literal local_108;
  undefined1 local_f0 [8];
  Literal right;
  undefined1 local_90 [8];
  Literal left;
  undefined1 local_68 [8];
  Flow flow;
  RefEq *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->left);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    left.type.id._0_4_ = 1;
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal((Literal *)local_90,pLVar3);
    visit((Flow *)&right.type,this,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
    Flow::operator=((Flow *)local_68,(Flow *)&right.type);
    Flow::~Flow((Flow *)&right.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      left.type.id._0_4_ = 1;
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal((Literal *)local_f0,pLVar3);
      bVar2 = ::wasm::Literal::operator==((Literal *)local_90,(Literal *)local_f0);
      wasm::Literal::Literal(&local_108,bVar2 & 1);
      Flow::Flow(__return_storage_ptr__,&local_108);
      ::wasm::Literal::~Literal(&local_108);
      left.type.id._0_4_ = 1;
      ::wasm::Literal::~Literal((Literal *)local_f0);
    }
    ::wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefEq(RefEq* curr) {
    NOTE_ENTER("RefEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    return Literal(int32_t(left == right));
  }